

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::TestRequired::ByteSizeLong(TestRequired *this)

{
  uint uVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  if ((uVar1 & 1) == 0) {
    sVar5 = 0;
  }
  else {
    uVar4 = (long)(this->field_0)._impl_.a_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = (size_t)((int)lVar2 * 9 + 0x89U >> 6);
  }
  if ((uVar1 & 2) != 0) {
    uVar4 = (long)(this->field_0)._impl_.dummy2_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
  }
  if ((uVar1 & 4) != 0) {
    uVar4 = (long)(this->field_0)._impl_.b_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
  }
  if ((uVar1 & 0xf8) != 0) {
    if ((uVar1 & 8) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy4_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 & 0x10) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy5_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 & 0x20) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy6_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 & 0x40) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy7_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((char)uVar1 < '\0') {
      uVar4 = (long)(this->field_0)._impl_.dummy8_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy9_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 >> 9 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy10_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 >> 10 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy11_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy12_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy13_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy14_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy15_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((short)uVar1 < 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy16_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 >> 0x10 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy17_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x11 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy18_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x12 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy19_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x13 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy20_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x14 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy21_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x15 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy22_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x16 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy23_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x17 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy24_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
  }
  if (0xffffff < uVar1) {
    if ((uVar1 >> 0x18 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy25_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x19 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy26_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x1a & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy27_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x1b & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy28_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x1c & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy29_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x1d & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy30_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0x1e & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.dummy31_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((int)uVar1 < 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::ForeignMessage>((this->field_0)._impl_.optional_foreign_)
      ;
      sVar5 = sVar5 + sVar3 + 2;
    }
  }
  uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[1];
  if ((uVar1 & 1) != 0) {
    uVar4 = (long)(this->field_0)._impl_.dummy32_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
  }
  if ((uVar1 & 2) != 0) {
    uVar4 = (long)(this->field_0)._impl_.c_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t TestRequired::ByteSizeLong() const {
  const TestRequired& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestRequired)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // int32 a = 1 [features = {
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_a());
    }
  }
   {
    // int32 dummy2 = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy2());
    }
  }
   {
    // int32 b = 3 [features = {
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_b());
    }
  }
  if ((cached_has_bits & 0x000000f8u) != 0) {
    // int32 dummy4 = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy4());
    }
    // int32 dummy5 = 5;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy5());
    }
    // int32 dummy6 = 6;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy6());
    }
    // int32 dummy7 = 7;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy7());
    }
    // int32 dummy8 = 8;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy8());
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // int32 dummy9 = 9;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy9());
    }
    // int32 dummy10 = 10;
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy10());
    }
    // int32 dummy11 = 11;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy11());
    }
    // int32 dummy12 = 12;
    if ((cached_has_bits & 0x00000800u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy12());
    }
    // int32 dummy13 = 13;
    if ((cached_has_bits & 0x00001000u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy13());
    }
    // int32 dummy14 = 14;
    if ((cached_has_bits & 0x00002000u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy14());
    }
    // int32 dummy15 = 15;
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy15());
    }
    // int32 dummy16 = 16;
    if ((cached_has_bits & 0x00008000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy16());
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    // int32 dummy17 = 17;
    if ((cached_has_bits & 0x00010000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy17());
    }
    // int32 dummy18 = 18;
    if ((cached_has_bits & 0x00020000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy18());
    }
    // int32 dummy19 = 19;
    if ((cached_has_bits & 0x00040000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy19());
    }
    // int32 dummy20 = 20;
    if ((cached_has_bits & 0x00080000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy20());
    }
    // int32 dummy21 = 21;
    if ((cached_has_bits & 0x00100000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy21());
    }
    // int32 dummy22 = 22;
    if ((cached_has_bits & 0x00200000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy22());
    }
    // int32 dummy23 = 23;
    if ((cached_has_bits & 0x00400000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy23());
    }
    // int32 dummy24 = 24;
    if ((cached_has_bits & 0x00800000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy24());
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    // int32 dummy25 = 25;
    if ((cached_has_bits & 0x01000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy25());
    }
    // int32 dummy26 = 26;
    if ((cached_has_bits & 0x02000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy26());
    }
    // int32 dummy27 = 27;
    if ((cached_has_bits & 0x04000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy27());
    }
    // int32 dummy28 = 28;
    if ((cached_has_bits & 0x08000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy28());
    }
    // int32 dummy29 = 29;
    if ((cached_has_bits & 0x10000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy29());
    }
    // int32 dummy30 = 30;
    if ((cached_has_bits & 0x20000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy30());
    }
    // int32 dummy31 = 31;
    if ((cached_has_bits & 0x40000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy31());
    }
    // .proto2_unittest.ForeignMessage optional_foreign = 34;
    if ((cached_has_bits & 0x80000000u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_foreign_);
    }
  }
   {
    // int32 dummy32 = 32;
    cached_has_bits = this_._impl_._has_bits_[1];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy32());
    }
  }
   {
    // int32 c = 33 [features = {
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_c());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}